

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O1

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  jpeg_entropy_decoder *pjVar4;
  int *piVar5;
  JBLOCKROW paJVar6;
  jpeg_error_mgr *pjVar7;
  jpeg_source_mgr *pjVar8;
  d_derived_tbl *htbl;
  boolean bVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  _func_void_j_decompress_ptr *get_buffer;
  int iVar15;
  long lVar16;
  undefined4 uVar17;
  uint uVar18;
  ulong uVar19;
  bitread_working_state br_state;
  int newnz_pos [64];
  int local_1a8;
  uint local_1a4;
  uint local_198;
  bitread_working_state local_180;
  j_decompress_ptr local_158;
  jpeg_entropy_decoder *local_150;
  d_derived_tbl *local_148;
  ulong local_140;
  int aiStack_138 [66];
  
  pjVar4 = cinfo->entropy;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar4[3].decode_mcu != 0)) ||
     (bVar9 = process_restart(cinfo), bVar9 != 0)) {
    local_150 = pjVar4;
    if (*(int *)((long)&pjVar4[3].start_pass + 4) == 0) {
      bVar1 = (byte)cinfo->Al;
      uVar14 = 1 << (bVar1 & 0x1f);
      uVar10 = -1 << (bVar1 & 0x1f);
      iVar3 = cinfo->Se;
      piVar5 = cinfo->natural_order;
      local_180.next_input_byte = cinfo->src->next_input_byte;
      local_180.bytes_in_buffer = cinfo->src->bytes_in_buffer;
      get_buffer = pjVar4[1].start_pass;
      uVar19 = (ulong)*(uint *)&pjVar4[1].decode_mcu;
      local_1a8 = *(int *)&pjVar4[2].start_pass;
      paJVar6 = *MCU_data;
      iVar15 = cinfo->Ss;
      local_180.cinfo = cinfo;
      local_158 = cinfo;
      if (iVar3 < iVar15 || local_1a8 != 0) {
        local_1a4 = 0;
      }
      else {
        local_148 = (d_derived_tbl *)pjVar4[6].start_pass;
        local_1a4 = 0;
        do {
          htbl = local_148;
          if ((int)uVar19 < 8) {
            bVar9 = jpeg_fill_bit_buffer(&local_180,(bit_buf_type)get_buffer,(int)uVar19,0);
            if (bVar9 != 0) {
              uVar19 = (ulong)(uint)local_180.bits_left;
              iVar13 = 1;
              get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer;
              if (7 < local_180.bits_left) goto LAB_002850bb;
              goto LAB_002850ec;
            }
            iVar13 = 5;
          }
          else {
LAB_002850bb:
            uVar12 = (long)get_buffer >> ((char)uVar19 - 8U & 0x3f) & 0xff;
            if (htbl->look_nbits[uVar12] == 0) {
              iVar13 = 9;
LAB_002850ec:
              local_198 = jpeg_huff_decode(&local_180,(bit_buf_type)get_buffer,(int)uVar19,htbl,
                                           iVar13);
              if ((int)local_198 < 0) {
                local_198 = 0xffffffff;
                iVar13 = 5;
              }
              else {
                iVar13 = 0;
                uVar19 = (ulong)(uint)local_180.bits_left;
                get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer;
              }
            }
            else {
              uVar19 = (ulong)(uint)((int)uVar19 - htbl->look_nbits[uVar12]);
              local_198 = (uint)htbl->look_sym[uVar12];
              iVar13 = 0;
            }
          }
          uVar18 = (uint)uVar19;
          if (iVar13 != 0) {
            if (iVar13 != 5) {
              return local_198;
            }
            goto LAB_00285324;
          }
          iVar13 = (int)local_198 >> 4;
          if ((local_198 & 0xf) == 0) {
            if (iVar13 != 0xf) {
              local_1a8 = 1 << ((byte)iVar13 & 0x1f);
              if (0xf < local_198) {
                if (((int)uVar18 < iVar13) &&
                   (bVar9 = jpeg_fill_bit_buffer(&local_180,(bit_buf_type)get_buffer,uVar18,iVar13),
                   get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer,
                   uVar18 = local_180.bits_left, bVar9 == 0)) goto LAB_00285324;
                uVar19 = (ulong)(uVar18 - iVar13);
                local_1a8 = ((uint)((long)get_buffer >> ((byte)(uVar18 - iVar13) & 0x3f)) &
                            bmask[iVar13]) + local_1a8;
              }
              break;
            }
            local_198 = 0;
          }
          else {
            if ((local_198 & 0xf) != 1) {
              pjVar7 = local_158->err;
              pjVar7->msg_code = 0x79;
              (*pjVar7->emit_message)((j_common_ptr)local_158,-1);
            }
            if (((int)uVar18 < 1) &&
               (bVar9 = jpeg_fill_bit_buffer(&local_180,(bit_buf_type)get_buffer,uVar18,1),
               get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer,
               uVar18 = local_180.bits_left, bVar9 == 0)) goto LAB_00285324;
            uVar19 = (ulong)(uVar18 - 1);
            local_198 = uVar14;
            if (((ulong)get_buffer >> (uVar19 & 0x3f) & 1) == 0) {
              local_198 = uVar10;
            }
          }
          iVar11 = iVar3;
          if (iVar3 < iVar15) {
            iVar11 = iVar15;
          }
          local_140 = (ulong)(iVar11 + 1);
          lVar16 = (long)iVar15 + -1;
          do {
            uVar18 = (uint)uVar19;
            iVar11 = piVar5[lVar16 + 1];
            if ((*paJVar6)[iVar11] == 0) {
              iVar11 = iVar15;
              if (iVar13 < 1) goto LAB_00285290;
              iVar13 = iVar13 + -1;
            }
            else {
              if (((int)uVar18 < 1) &&
                 (bVar9 = jpeg_fill_bit_buffer(&local_180,(bit_buf_type)get_buffer,uVar18,1),
                 get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer,
                 uVar18 = local_180.bits_left, bVar9 == 0)) goto LAB_00285324;
              uVar19 = (ulong)(uVar18 - 1);
              if ((((ulong)get_buffer >> (uVar19 & 0x3f) & 1) != 0) &&
                 (sVar2 = (*paJVar6)[iVar11], (uVar14 & (int)sVar2) == 0)) {
                uVar18 = uVar14;
                if (sVar2 < 0) {
                  uVar18 = uVar10;
                }
                (*paJVar6)[iVar11] = (short)uVar18 + sVar2;
              }
            }
            iVar15 = iVar15 + 1;
            lVar16 = lVar16 + 1;
          } while (lVar16 < iVar3);
          iVar11 = (int)local_140;
LAB_00285290:
          if (local_198 != 0) {
            iVar15 = piVar5[iVar11];
            (*paJVar6)[iVar15] = (JCOEF)local_198;
            lVar16 = (long)(int)local_1a4;
            local_1a4 = local_1a4 + 1;
            aiStack_138[lVar16] = iVar15;
          }
          iVar15 = iVar11 + 1;
        } while (iVar11 < iVar3);
      }
      uVar17 = (undefined4)uVar19;
      if (local_1a8 == 0) {
        local_1a8 = 0;
      }
      else {
        if (iVar15 <= iVar3) {
          lVar16 = 0;
          do {
            uVar18 = (uint)uVar19;
            iVar13 = piVar5[iVar15 + lVar16];
            if ((*paJVar6)[iVar13] != 0) {
              if (((int)uVar18 < 1) &&
                 (bVar9 = jpeg_fill_bit_buffer(&local_180,(bit_buf_type)get_buffer,uVar18,1),
                 get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer,
                 uVar18 = local_180.bits_left, bVar9 == 0)) {
LAB_00285324:
                if ((int)local_1a4 < 1) {
                  return 0;
                }
                lVar16 = (ulong)local_1a4 + 1;
                do {
                  (*paJVar6)[aiStack_138[lVar16 + -2]] = 0;
                  lVar16 = lVar16 + -1;
                } while (1 < lVar16);
                return 0;
              }
              uVar19 = (ulong)(uVar18 - 1);
              if ((((ulong)get_buffer >> (uVar19 & 0x3f) & 1) != 0) &&
                 (sVar2 = (*paJVar6)[iVar13], (uVar14 & (int)sVar2) == 0)) {
                uVar18 = uVar14;
                if (sVar2 < 0) {
                  uVar18 = uVar10;
                }
                (*paJVar6)[iVar13] = (short)uVar18 + sVar2;
              }
            }
            uVar17 = (undefined4)uVar19;
            lVar16 = lVar16 + 1;
          } while ((iVar3 - iVar15) + 1 != (int)lVar16);
        }
        local_1a8 = local_1a8 + -1;
      }
      pjVar8 = local_158->src;
      pjVar8->next_input_byte = local_180.next_input_byte;
      pjVar8->bytes_in_buffer = local_180.bytes_in_buffer;
      local_150[1].start_pass = get_buffer;
      *(undefined4 *)&local_150[1].decode_mcu = uVar17;
      *(int *)&local_150[2].start_pass = local_1a8;
    }
    *(int *)&local_150[3].decode_mcu = *(int *)&local_150[3].decode_mcu + -1;
    bVar9 = 1;
  }
  else {
    bVar9 = 0;
  }
  return bVar9;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{   
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int s, k, r;
  unsigned int EOBRUN;
  int Se, p1, m1;
  const int * natural_order;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  BITREAD_STATE_VARS;
  d_derived_tbl * tbl;
  int num_newnz;
  int newnz_pos[DCTSIZE2];

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! process_restart(cinfo))
	return FALSE;
  }

  /* If we've run out of data, don't modify the MCU.
   */
  if (! entropy->insufficient_data) {

    Se = cinfo->Se;
    p1 = 1 << cinfo->Al;	/* 1 in the bit position being coded */
    m1 = (-1) << cinfo->Al;	/* -1 in the bit position being coded */
    natural_order = cinfo->natural_order;

    /* Load up working state */
    BITREAD_LOAD_STATE(cinfo,entropy->bitstate);
    EOBRUN = entropy->saved.EOBRUN; /* only part of saved state we need */

    /* There is always only one block per MCU */
    block = MCU_data[0];
    tbl = entropy->ac_derived_tbl;

    /* If we are forced to suspend, we must undo the assignments to any newly
     * nonzero coefficients in the block, because otherwise we'd get confused
     * next time about which coefficients were already nonzero.
     * But we need not undo addition of bits to already-nonzero coefficients;
     * instead, we can test the current bit to see if we already did it.
     */
    num_newnz = 0;

    /* initialize coefficient loop counter to start of band */
    k = cinfo->Ss;

    if (EOBRUN == 0) {
      for (; k <= Se; k++) {
	HUFF_DECODE(s, br_state, tbl, goto undoit, label3);
	r = s >> 4;
	s &= 15;
	if (s) {
	  if (s != 1)		/* size of new coef should always be 1 */
	    WARNMS(cinfo, JWRN_HUFF_BAD_CODE);
	  CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	  if (GET_BITS(1))
	    s = p1;		/* newly nonzero coef is positive */
	  else
	    s = m1;		/* newly nonzero coef is negative */
	} else {
	  if (r != 15) {
	    EOBRUN = 1 << r;	/* EOBr, run length is 2^r + appended bits */
	    if (r) {
	      CHECK_BIT_BUFFER(br_state, r, goto undoit);
	      r = GET_BITS(r);
	      EOBRUN += r;
	    }
	    break;		/* rest of block is handled by EOB logic */
	  }
	  /* note s = 0 for processing ZRL */
	}
	/* Advance over already-nonzero coefs and r still-zero coefs,
	 * appending correction bits to the nonzeroes.  A correction bit is 1
	 * if the absolute value of the coefficient must be increased.
	 */
	do {
	  thiscoef = *block + natural_order[k];
	  if (*thiscoef != 0) {
	    CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	    if (GET_BITS(1)) {
	      if ((*thiscoef & p1) == 0) { /* do nothing if already set it */
		if (*thiscoef >= 0)
		  *thiscoef += p1;
		else
		  *thiscoef += m1;
	      }
	    }
	  } else {
	    if (--r < 0)
	      break;		/* reached target zero coefficient */
	  }
	  k++;
	} while (k <= Se);
	if (s) {
	  int pos = natural_order[k];
	  /* Output newly nonzero coefficient */
	  (*block)[pos] = (JCOEF) s;
	  /* Remember its position in case we have to suspend */
	  newnz_pos[num_newnz++] = pos;
	}
      }
    }

    if (EOBRUN > 0) {
      /* Scan any remaining coefficient positions after the end-of-band
       * (the last newly nonzero coefficient, if any).  Append a correction
       * bit to each already-nonzero coefficient.  A correction bit is 1
       * if the absolute value of the coefficient must be increased.
       */
      for (; k <= Se; k++) {
	thiscoef = *block + natural_order[k];
	if (*thiscoef != 0) {
	  CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	  if (GET_BITS(1)) {
	    if ((*thiscoef & p1) == 0) { /* do nothing if already changed it */
	      if (*thiscoef >= 0)
		*thiscoef += p1;
	      else
		*thiscoef += m1;
	    }
	  }
	}
      }
      /* Count one block completed in EOB run */
      EOBRUN--;
    }

    /* Completed MCU, so update state */
    BITREAD_SAVE_STATE(cinfo,entropy->bitstate);
    entropy->saved.EOBRUN = EOBRUN; /* only part of saved state we need */
  }

  /* Account for restart interval (no-op if not using restarts) */
  entropy->restarts_to_go--;

  return TRUE;

undoit:
  /* Re-zero any output coefficients that we made newly nonzero */
  while (num_newnz > 0)
    (*block)[newnz_pos[--num_newnz]] = 0;

  return FALSE;
}